

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

ssize_t __thiscall HttpConn::read(HttpConn *this,int __fd,void *__buf,size_t __nbytes)

{
  EventLoop *pEVar1;
  size_type sVar2;
  char *pcVar3;
  ssize_t sVar4;
  ssize_t extraout_RAX;
  element_type *this_00;
  HttpConn *extraout_RAX_00;
  HttpConn *extraout_RAX_01;
  size_t __n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_00;
  int iVar5;
  HttpConn *local_118;
  code *local_110;
  undefined8 local_108;
  type local_100;
  Functor local_e8;
  HttpConn *local_c8;
  code *local_c0;
  undefined8 local_b8;
  type local_b0;
  Functor local_98;
  StatusCode local_78;
  StatusCode c;
  HttpConn *local_68;
  code *local_60;
  undefined8 local_58;
  type local_50;
  Functor local_38;
  int local_14;
  HttpConn *pHStack_10;
  int readBytes;
  HttpConn *this_local;
  
  pHStack_10 = this;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->readBuff_);
  if (sVar2 == (long)this->read_idx_) {
    sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->readBuff_);
    std::vector<char,_std::allocator<char>_>::resize(&this->readBuff_,sVar2 << 1);
  }
  iVar5 = this->fd_;
  pcVar3 = std::vector<char,_std::allocator<char>_>::data(&this->readBuff_);
  __n = (size_t)this->read_idx_;
  pcVar3 = pcVar3 + __n;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(&this->readBuff_);
  sVar4 = readn(iVar5,pcVar3,sVar2 - (long)this->read_idx_);
  iVar5 = (int)pcVar3;
  local_14 = (int)sVar4;
  if (local_14 < 0) {
    std::__cxx11::string::operator=((string *)&this->body_,"Read Socket Error!");
    handleResponse(this,BadRequest);
  }
  else if (local_14 == 0) {
    this->connStatus_ = Disconnecting;
    __buf_00 = extraout_RDX;
    if (this->parseState_ != Finished) {
      std::__cxx11::string::operator=((string *)&this->body_,"Request is not complete!");
      iVar5 = 400;
      handleResponse(this,BadRequest);
      __buf_00 = extraout_RDX_00;
    }
    if ((this->writeable_ & 1U) == 0) {
      pEVar1 = this->loop_;
      local_60 = close;
      local_58 = 0;
      local_68 = this;
      std::bind<void(HttpConn::*)(),HttpConn*>
                (&local_50,(offset_in_HttpConn_to_subr *)&local_60,&local_68);
      std::function<void()>::function<std::_Bind<void(HttpConn::*(HttpConn*))()>,void>
                ((function<void()> *)&local_38,&local_50);
      EventLoop::runInLoop(pEVar1,&local_38);
      std::function<void_()>::~function(&local_38);
      return extraout_RAX;
    }
    write(this,iVar5,__buf_00,__n);
  }
  else {
    this->read_idx_ = local_14 + this->read_idx_;
    local_78 = parseRequest(this);
    if (local_78 == Wait) {
      this_00 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )&this->channel_);
      Channel::update(this_00);
    }
    else {
      handleResponse(this,local_78);
    }
  }
  if (this->connStatus_ == Connected) {
    if ((this->linger_ & 1U) == 0) {
      pEVar1 = this->loop_;
      iVar5 = this->id_;
      local_110 = close;
      local_108 = 0;
      local_118 = this;
      std::bind<void(HttpConn::*)(),HttpConn*>
                (&local_100,(offset_in_HttpConn_to_subr *)&local_110,&local_118);
      std::function<void()>::function<std::_Bind<void(HttpConn::*(HttpConn*))()>,void>
                ((function<void()> *)&local_e8,&local_100);
      EventLoop::addTimer(pEVar1,iVar5,8000,&local_e8);
      std::function<void_()>::~function(&local_e8);
      this = extraout_RAX_01;
    }
    else {
      pEVar1 = this->loop_;
      iVar5 = this->id_;
      local_c0 = close;
      local_b8 = 0;
      local_c8 = this;
      std::bind<void(HttpConn::*)(),HttpConn*>
                (&local_b0,(offset_in_HttpConn_to_subr *)&local_c0,&local_c8);
      std::function<void()>::function<std::_Bind<void(HttpConn::*(HttpConn*))()>,void>
                ((function<void()> *)&local_98,&local_b0);
      EventLoop::addTimer(pEVar1,iVar5,90000,&local_98);
      std::function<void_()>::~function(&local_98);
      this = extraout_RAX_00;
    }
  }
  return (ssize_t)this;
}

Assistant:

void HttpConn::read() {
    if (readBuff_.size() - read_idx_ == 0) readBuff_.resize(readBuff_.size() * 2);
    int readBytes = readn(fd_, readBuff_.data() + read_idx_, readBuff_.size() - read_idx_);
    if (readBytes < 0) {
        body_ = "Read Socket Error!";
        handleResponse(BadRequest);
    } else if (readBytes == 0) {
        connStatus_ = Disconnecting;
        if (parseState_ != Finished) {
            body_ = "Request is not complete!";
            handleResponse(BadRequest);
        }
        if (writeable_) 
            write();
        else {
            loop_->runInLoop(std::bind(&HttpConn::close, this));
            return;
        }
        
    }
    else {
        read_idx_ += readBytes;
        StatusCode c = parseRequest();
        if (c != Wait) {
            handleResponse(c);
        } else {
            channel_->update();
        }
    }
    
    if (connStatus_ == Connected) {
        if (linger_) 
            loop_->addTimer(id_, keepAliveTimeout, std::bind(&HttpConn::close, this)); 
        else 
            loop_->addTimer(id_, defaultTimeout, std::bind(&HttpConn::close, this));   
    }
    // handleConn();
}